

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O1

h__Reader * __thiscall
AS_02::PCM::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename,Rational *edit_rate)

{
  double dVar1;
  undefined4 uVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ILogSink *pIVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  uint uVar10;
  int *in_RCX;
  char *fmt;
  char buf [64];
  IndexEntry tmp_entry;
  int64_t tmp_pos;
  Result_t result;
  InterchangeObject *tmp_obj;
  undefined1 local_1a8 [9];
  byte_t local_19f [7];
  byte_t bStack_198;
  byte_t abStack_197 [7];
  byte_t bStack_190;
  code *local_138;
  undefined2 local_130;
  undefined1 local_12e;
  undefined8 local_128;
  _Alloc_hider local_120;
  undefined1 local_118;
  undefined8 local_117;
  undefined8 uStack_10f;
  undefined1 local_100 [104];
  undefined **local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_80;
  ulong uStack_78;
  undefined **local_70;
  ui64_t local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_138 = ASDCP::MXF::Partition::WriteToFile;
  local_130 = 0;
  local_12e = 0x80;
  local_128 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,(char *)*edit_rate,(allocator<char> *)&local_98);
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)local_100,filename);
  if ((byte_t *)local_1a8._0_8_ != &bStack_198) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(abStack_197,bStack_198) + 1);
  }
  if ((int)local_100._0_4_ < 0) {
LAB_001488fb:
    lVar6 = 0;
  }
  else {
    local_98 = (undefined **)0x0;
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              (local_1a8,(InterchangeObject **)((long)&filename->field_2 + 8));
    uVar2 = local_1a8._0_4_;
    Kumu::Result_t::~Result_t((Result_t *)local_1a8);
    if (((int)uVar2 < 0) || (local_98 == (undefined **)0x0)) goto LAB_001488fb;
    lVar6 = __dynamic_cast(local_98,&ASDCP::MXF::InterchangeObject::typeinfo,
                           &ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
  }
  if (lVar6 == 0) {
    pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar7,"WaveAudioDescriptor object not found.\n");
    Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)RESULT_AS02_FORMAT);
  }
  if (-1 < (int)local_100._0_4_) {
    MXF::AS02IndexReader::Lookup
              ((AS02IndexReader *)local_1a8,(int)filename + 0x230,(IndexEntry *)0x0);
    Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)local_1a8);
    Kumu::Result_t::~Result_t((Result_t *)local_1a8);
  }
  if (-1 < (int)local_100._0_4_) {
    (**(code **)(**(long **)&filename->field_2 + 0x28))
              (local_1a8,*(long **)&filename->field_2,local_128,0);
    Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)local_1a8);
    Kumu::Result_t::~Result_t((Result_t *)local_1a8);
  }
  if (-1 < (int)local_100._0_4_) {
    if (lVar6 == 0) {
      __assert_fail("wave_descriptor",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                    ,0x65,
                    "ASDCP::Result_t AS_02::PCM::MXFReader::h__Reader::OpenRead(const std::string &, const ASDCP::Rational &)"
                   );
    }
    local_90 = 0;
    local_88 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = &PTR__IArchive_0016cc90;
    local_98 = &PTR__KLVPacket_0016d4e0;
    ASDCP::KLReader::ReadKLFromFile((IFileReader *)local_1a8);
    Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)local_1a8);
    Kumu::Result_t::~Result_t((Result_t *)local_1a8);
    if (-1 < (int)local_100._0_4_) {
      local_1a8[8] = true;
      local_19f = SUB87(local_50,0);
      bStack_198 = SUB81(local_50,7);
      abStack_197 = SUB87(uStack_48,0);
      bStack_190 = SUB81(uStack_48,7);
      local_1a8._0_8_ = &PTR__IArchive_0016cc90;
      puVar8 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
      local_118 = 1;
      local_117 = *puVar8;
      uStack_10f = puVar8[1];
      local_120._M_p = (pointer)&PTR__IArchive_0016cc90;
      cVar4 = ASDCP::UL::MatchIgnoreStream((UL *)local_1a8);
      if (cVar4 == '\0') {
        lVar6 = ASDCP::Dictionary::FindULAnyVersion((uchar *)filename->_M_string_length);
        if (lVar6 == 0) {
          pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
          local_118 = 1;
          local_117 = local_50;
          uStack_10f = uStack_48;
          local_120._M_p = (pointer)&PTR__IArchive_0016cc90;
          uVar9 = ASDCP::UL::EncodeString((char *)&local_120,(uint)local_1a8);
          Kumu::ILogSink::Error(pIVar7,"Essence wrapper key is not WAVEssenceClip: %s\n",uVar9);
        }
        else {
          pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (pIVar7,"Essence wrapper key is not WAVEssenceClip: %s\n",
                     *(undefined8 *)(lVar6 + 0x18));
        }
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
        goto LAB_00148c33;
      }
      if ((ulong)*(ushort *)(lVar6 + 0x1b8) == 0) {
        pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
        fmt = "EssenceDescriptor has corrupt BlockAlign value, unable to continue.\n";
      }
      else {
        if (uStack_78 % (ulong)*(ushort *)(lVar6 + 0x1b8) == 0) {
          (**(code **)(**(long **)&filename->field_2 + 0x30))
                    (local_1a8,*(long **)&filename->field_2,&local_120);
          Kumu::Result_t::~Result_t((Result_t *)local_1a8);
          uVar3 = uStack_78;
          filename[0x28]._M_dataplus._M_p = local_120._M_p;
          filename[0x28]._M_string_length = uStack_78;
          uVar10 = *(uint *)(lVar6 + 0x16c);
          iVar5 = *(int *)(lVar6 + 0x168);
          dVar1 = ceil(((double)*(int *)(lVar6 + 0x158) / (double)*(int *)(lVar6 + 0x15c)) /
                       ((double)*in_RCX / (double)in_RCX[1]));
          uVar10 = (int)(long)dVar1 * (uVar10 >> 3) * iVar5;
          *(uint *)((long)&filename[0x28].field_2 + 4) = uVar10;
          iVar5 = (int)(uVar3 / uVar10);
          *(int *)&filename[0x28].field_2 = iVar5;
          if (uVar3 % (ulong)uVar10 != 0) {
            *(int *)&filename[0x28].field_2 = iVar5 + 1;
          }
          goto LAB_00148c23;
        }
        pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
        fmt = "Clip length is not an even multiple of BlockAlign, unable to continue.\n";
      }
      Kumu::ILogSink::Error(pIVar7,fmt);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
      goto LAB_00148c33;
    }
  }
LAB_00148c23:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_100);
LAB_00148c33:
  Kumu::Result_t::~Result_t((Result_t *)local_100);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFReader::h__Reader::OpenRead(const std::string& filename, const ASDCP::Rational& edit_rate)
{
  ASDCP::MXF::WaveAudioDescriptor* wave_descriptor = 0;
  IndexTableSegment::IndexEntry tmp_entry;
  Result_t result = OpenMXFRead(filename.c_str());

  if( KM_SUCCESS(result) )
    {
      InterchangeObject* tmp_obj = 0;

      if ( KM_SUCCESS(m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(WaveAudioDescriptor), &tmp_obj)) )
	{
	  wave_descriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(tmp_obj);
	}
    }

  if ( wave_descriptor == 0 )
    {
      DefaultLogSink().Error("WaveAudioDescriptor object not found.\n");
      result = RESULT_AS02_FORMAT;
    }

  if ( KM_SUCCESS(result) )
    result = m_IndexAccess.Lookup(0, tmp_entry);

  if ( KM_SUCCESS(result) )
    result = m_File->Seek(tmp_entry.StreamOffset);

  if ( KM_SUCCESS(result) )
    {
      assert(wave_descriptor);
      KLReader reader;
      result = reader.ReadKLFromFile(*m_File);

      if ( KM_SUCCESS(result) )
	{
	  if ( ! UL(reader.Key()).MatchIgnoreStream(m_Dict->ul(MDD_WAVEssenceClip)) )
	    {
	      const MDDEntry *entry = m_Dict->FindULAnyVersion(reader.Key());

	      if ( entry == 0 )
		{
		  char buf[64];
		  DefaultLogSink().Error("Essence wrapper key is not WAVEssenceClip: %s\n", UL(reader.Key()).EncodeString(buf, 64));
		}
	      else
		{
		  DefaultLogSink().Error("Essence wrapper key is not WAVEssenceClip: %s\n", entry->name);
		}
	      
	      return RESULT_AS02_FORMAT;
	    }

	  if ( wave_descriptor->BlockAlign == 0 )
	    {
	      DefaultLogSink().Error("EssenceDescriptor has corrupt BlockAlign value, unable to continue.\n");
	      return RESULT_AS02_FORMAT;
	    }

	  if ( reader.Length() % wave_descriptor->BlockAlign != 0 )
	    {
	      DefaultLogSink().Error("Clip length is not an even multiple of BlockAlign, unable to continue.\n");
	      return RESULT_AS02_FORMAT;
	    }

	  m_ClipEssenceBegin = m_File->TellPosition();
	  m_ClipSize = reader.Length();
	  m_BytesPerFrame = AS_02::MXF::CalcFrameBufferSize(*wave_descriptor, edit_rate);
	  m_ClipDurationFrames = m_ClipSize / m_BytesPerFrame;

	  if ( m_ClipSize % m_BytesPerFrame > 0 )
	    {
	      ++m_ClipDurationFrames; // there is a partial frame at the end
	    }
	}
    }

  return result;
}